

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeThreadData.cpp
# Opt level: O0

void __thiscall RuntimeThreadData::~RuntimeThreadData(RuntimeThreadData *this)

{
  RuntimeThreadData *this_local;
  
  CloseHandle(this->hevntInitialScriptCompleted);
  CloseHandle(this->hevntReceivedBroadcast);
  CloseHandle(this->hevntShutdown);
  CloseHandle(this->hThread);
  DeleteCriticalSection(&this->csReportQ);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list(&this->reportQ);
  std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::~list
            (&this->children);
  std::__cxx11::string::~string((string *)&this->initialSource);
  return;
}

Assistant:

RuntimeThreadData::~RuntimeThreadData()
{
    CloseHandle(this->hevntInitialScriptCompleted);
    CloseHandle(this->hevntReceivedBroadcast);
    CloseHandle(this->hevntShutdown);
    CloseHandle(this->hThread);
    DeleteCriticalSection(&csReportQ);
}